

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_compile_augment_children
                 (lysc_ctx *ctx,lysp_when *aug_when,uint16_t aug_flags,lysp_node *child,
                 lysc_node *target,ly_bool child_unres_disabled)

{
  undefined4 uVar1;
  ly_ctx *ctx_00;
  lysc_node *parent;
  uint16_t inherited_flags;
  lysp_when *when_p;
  lysp_when *ctx_01;
  char *pcVar2;
  char *pcVar3;
  lysc_node *ctx_node;
  uint local_6c;
  uint32_t opt_prev;
  uint32_t i;
  ly_set child_set;
  ly_bool allow_mand;
  lysc_when *plStack_50;
  ly_bool enabled;
  lysc_when *when_shared;
  lysc_node *node;
  lysp_node *pnode;
  LY_ERR rc;
  ly_bool child_unres_disabled_local;
  lysc_node *target_local;
  lysp_node *child_local;
  lysp_when *plStack_18;
  uint16_t aug_flags_local;
  lysp_when *aug_when_local;
  lysc_ctx *ctx_local;
  
  pnode._0_4_ = LY_SUCCESS;
  plStack_50 = (lysc_when *)0x0;
  child_set.field_2._6_1_ = 0;
  pnode._7_1_ = child_unres_disabled;
  _rc = target;
  target_local = (lysc_node *)child;
  child_local._6_2_ = aug_flags;
  plStack_18 = aug_when;
  aug_when_local = (lysp_when *)ctx;
  memset(&opt_prev,0,0x10);
  uVar1 = *(undefined4 *)((long)&aug_when_local[4].dsc + 4);
  if (((plStack_18 != (lysp_when *)0x0) || (_rc->nodetype == 2)) ||
     ((lys_module *)aug_when_local->dsc == _rc->module)) {
    child_set.field_2._6_1_ = 1;
  }
  node = target_local;
  do {
    if (node == (lysc_node *)0x0) {
LAB_00186e0a:
      ly_set_erase((ly_set *)&opt_prev,(_func_void_void_ptr *)0x0);
      *(undefined4 *)((long)&aug_when_local[4].dsc + 4) = uVar1;
      return (LY_ERR)pnode;
    }
    if ((((*(short *)&node->module == 0x80) && (_rc->nodetype != 2)) ||
        ((((ulong)node->module & 0x700) != 0 && ((_rc->nodetype & 0x11) == 0)))) ||
       ((*(short *)&node->module == 0x800 && (_rc->nodetype == 2)))) {
      ctx_00 = (ly_ctx *)aug_when_local->cond;
      pcVar2 = lys_nodetype2str(_rc->nodetype);
      pcVar3 = lys_nodetype2str(*(uint16_t *)&node->module);
      ly_vlog(ctx_00,(char *)0x0,LYVE_REFERENCE,
              "Invalid augment of %s node which is not allowed to contain %s node \"%s\".",pcVar2,
              pcVar3,node->next);
      pnode._0_4_ = LY_EVALID;
      goto LAB_00186e0a;
    }
    if (_rc->nodetype == 2) {
      pnode._0_4_ = lys_compile_node_choice_child
                              ((lysc_ctx *)aug_when_local,(lysp_node *)node,_rc,(ly_set *)&opt_prev)
      ;
    }
    else if ((_rc->nodetype & 0x3000) == 0) {
      pnode._0_4_ = lys_compile_node((lysc_ctx *)aug_when_local,(lysp_node *)node,_rc,
                                     child_local._6_2_,(ly_set *)&opt_prev);
    }
    else {
      if (_rc->nodetype == 0x1000) {
        *(uint *)((long)&aug_when_local[4].dsc + 4) =
             *(uint *)((long)&aug_when_local[4].dsc + 4) | 0x1004;
      }
      else {
        *(uint *)((long)&aug_when_local[4].dsc + 4) =
             *(uint *)((long)&aug_when_local[4].dsc + 4) | 0x2004;
      }
      pnode._0_4_ = lys_compile_node((lysc_ctx *)aug_when_local,(lysp_node *)node,_rc,
                                     child_local._6_2_,(ly_set *)&opt_prev);
    }
    if ((LY_ERR)pnode != LY_SUCCESS) goto LAB_00186e0a;
    pnode._0_4_ = 0;
    pnode._0_4_ = lys_eval_iffeatures((ly_ctx *)aug_when_local->cond,(lysp_qname *)node->dsc,
                                      (ly_bool *)((long)&child_set.field_2 + 7));
    if ((LY_ERR)pnode != LY_SUCCESS) goto LAB_00186e0a;
    if ((child_set.field_2._7_1_ == '\0') && (((ulong)aug_when_local[4].dsc & 0xb00000000) == 0)) {
      *(uint *)((long)&aug_when_local[4].dsc + 4) = *(uint *)((long)&aug_when_local[4].dsc + 4) | 2;
    }
    for (local_6c = 0; ctx_01 = aug_when_local, when_p = plStack_18,
        inherited_flags = child_local._6_2_, parent = _rc, local_6c < i; local_6c = local_6c + 1) {
      when_shared = *(lysc_when **)(child_set._0_8_ + (ulong)local_6c * 8);
      if (((child_set.field_2._6_1_ == '\0') && (((ulong)when_shared->cond & 0x10000) != 0)) &&
         (((ulong)when_shared->cond & 0x200000) != 0)) {
        *(ushort *)((long)&when_shared->cond + 2) =
             *(ushort *)((long)&when_shared->cond + 2) & 0xffdf;
        lys_compile_mandatory_parents(_rc,'\0');
        ly_vlog((ly_ctx *)aug_when_local->cond,(char *)0x0,LYVE_SEMANTICS,
                "Invalid augment adding mandatory node \"%s\" without making it conditional via when statement."
                ,when_shared->exts);
        pnode._0_4_ = LY_EVALID;
        goto LAB_00186e0a;
      }
      if (plStack_18 != (lysp_when *)0x0) {
        ctx_node = lysc_data_node(_rc);
        pnode._0_4_ = lys_compile_when((lysc_ctx *)ctx_01,when_p,inherited_flags,parent,ctx_node,
                                       (lysc_node *)when_shared,&stack0xffffffffffffffb0);
        if ((LY_ERR)pnode != LY_SUCCESS) goto LAB_00186e0a;
      }
      if (pnode._7_1_ != '\0') {
        ly_set_add((ly_set *)(aug_when_local[4].cond + 0x40),when_shared,'\x01',(uint32_t *)0x0);
      }
    }
    ly_set_erase((ly_set *)&opt_prev,(_func_void_void_ptr *)0x0);
    *(undefined4 *)((long)&aug_when_local[4].dsc + 4) = uVar1;
    node = node->parent;
  } while( true );
}

Assistant:

static LY_ERR
lys_compile_augment_children(struct lysc_ctx *ctx, struct lysp_when *aug_when, uint16_t aug_flags, struct lysp_node *child,
        struct lysc_node *target, ly_bool child_unres_disabled)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysp_node *pnode;
    struct lysc_node *node;
    struct lysc_when *when_shared = NULL;
    ly_bool enabled, allow_mand = 0;
    struct ly_set child_set = {0};
    uint32_t i, opt_prev = ctx->compile_opts;

    /* check for mandatory nodes
     * - new cases augmenting some choice can have mandatory nodes
     * - mandatory nodes are allowed only in case the augmentation is made conditional with a when statement
     */
    if (aug_when || (target->nodetype == LYS_CHOICE) || (ctx->cur_mod == target->module)) {
        allow_mand = 1;
    }

    LY_LIST_FOR(child, pnode) {
        /* check if the subnode can be connected to the found target (e.g. case cannot be inserted into container) */
        if (((pnode->nodetype == LYS_CASE) && (target->nodetype != LYS_CHOICE)) ||
                ((pnode->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)) && !(target->nodetype & (LYS_CONTAINER | LYS_LIST))) ||
                ((pnode->nodetype == LYS_USES) && (target->nodetype == LYS_CHOICE))) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid augment of %s node which is not allowed to contain %s node \"%s\".",
                    lys_nodetype2str(target->nodetype), lys_nodetype2str(pnode->nodetype), pnode->name);
            rc = LY_EVALID;
            goto cleanup;
        }

        /* compile the children */
        if (target->nodetype == LYS_CHOICE) {
            LY_CHECK_GOTO(rc = lys_compile_node_choice_child(ctx, pnode, target, &child_set), cleanup);
        } else if (target->nodetype & (LYS_INPUT | LYS_OUTPUT)) {
            if (target->nodetype == LYS_INPUT) {
                ctx->compile_opts |= LYS_COMPILE_RPC_INPUT;
            } else {
                ctx->compile_opts |= LYS_COMPILE_RPC_OUTPUT;
            }
            LY_CHECK_GOTO(rc = lys_compile_node(ctx, pnode, target, aug_flags, &child_set), cleanup);
        } else {
            LY_CHECK_GOTO(rc = lys_compile_node(ctx, pnode, target, aug_flags, &child_set), cleanup);
        }

        /* eval if-features again for the rest of this node processing */
        LY_CHECK_GOTO(rc = lys_eval_iffeatures(ctx->ctx, pnode->iffeatures, &enabled), cleanup);
        if (!enabled && !(ctx->compile_opts & (LYS_COMPILE_NO_DISABLED | LYS_COMPILE_DISABLED | LYS_COMPILE_GROUPING))) {
            ctx->compile_opts |= LYS_COMPILE_DISABLED;
        }

        /* since the augment node is not present in the compiled tree, we need to pass some of its
         * statements to all its children */
        for (i = 0; i < child_set.count; ++i) {
            node = child_set.snodes[i];
            if (!allow_mand && (node->flags & LYS_CONFIG_W) && (node->flags & LYS_MAND_TRUE)) {
                node->flags &= ~LYS_MAND_TRUE;
                lys_compile_mandatory_parents(target, 0);
                LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                        "Invalid augment adding mandatory node \"%s\" without making it conditional via when statement.",
                        node->name);
                rc = LY_EVALID;
                goto cleanup;
            }

            if (aug_when) {
                /* pass augment's when to all the children */
                rc = lys_compile_when(ctx, aug_when, aug_flags, target, lysc_data_node(target), node, &when_shared);
                LY_CHECK_GOTO(rc, cleanup);
            }

            if (child_unres_disabled) {
                /* child is disabled by the augment if-features */
                ly_set_add(&ctx->unres->disabled, node, 1, NULL);
            }
        }

        /* next iter */
        ly_set_erase(&child_set, NULL);
        ctx->compile_opts = opt_prev;
    }

cleanup:
    ly_set_erase(&child_set, NULL);
    ctx->compile_opts = opt_prev;
    return rc;
}